

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayoutState::fitLayout(QMainWindowLayoutState *this)

{
  long lVar1;
  Representation RVar2;
  Representation RVar3;
  Representation RVar4;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect QVar5;
  QToolBarAreaLayout *in_stack_00000018;
  QRect r;
  undefined8 local_28;
  undefined8 uStack_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QRect::QRect(in_RDI);
  RVar2.m_i = (in_RDI->y1).m_i;
  RVar3.m_i = (in_RDI->x2).m_i;
  RVar4.m_i = (in_RDI->y2).m_i;
  in_RDI[1].x2 = (Representation)(in_RDI->x1).m_i;
  in_RDI[1].y2 = (Representation)RVar2.m_i;
  in_RDI[2].x1 = (Representation)RVar3.m_i;
  in_RDI[2].y1 = (Representation)RVar4.m_i;
  QVar5 = QToolBarAreaLayout::fitLayout(in_stack_00000018);
  local_28 = QVar5._0_8_;
  uStack_20 = QVar5._8_8_;
  in_RDI[0x12].x2 = (Representation)(undefined4)local_28;
  in_RDI[0x12].y2 = (Representation)local_28._4_4_;
  in_RDI[0x13].x1 = (Representation)(undefined4)uStack_20;
  in_RDI[0x13].y1 = (Representation)uStack_20._4_4_;
  QDockAreaLayout::fitLayout((QDockAreaLayout *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayoutState::fitLayout()
{
    QRect r;
#if !QT_CONFIG(toolbar)
    r = rect;
#else
    toolBarAreaLayout.rect = rect;
    r = toolBarAreaLayout.fitLayout();
#endif // QT_CONFIG(toolbar)

#if QT_CONFIG(dockwidget)
    dockAreaLayout.rect = r;
    dockAreaLayout.fitLayout();
#else
    centralWidgetRect = r;
#endif
}